

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O0

void __thiscall cmELF::cmELF(cmELF *this,char *fname)

{
  bool bVar1;
  byte bVar2;
  pointer pbVar3;
  type pbVar4;
  long *plVar5;
  cmELFInternalImpl<cmELFTypes32> *this_00;
  cmELFInternalImpl<cmELFTypes64> *this_01;
  ByteOrderType local_5c;
  undefined1 auStack_58 [4];
  ByteOrderType order;
  __mbstate_t local_50;
  char local_48;
  char local_47;
  char local_46;
  char local_45;
  char local_44;
  char local_43;
  char ident [16];
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  local_20;
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  fin;
  char *fname_local;
  cmELF *this_local;
  
  this->Internal = (cmELFInternal *)0x0;
  fin._M_t.
  super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>,_true,_true>
          )fname;
  std::__cxx11::string::string((string *)&this->ErrorMessage);
  pbVar3 = (pointer)operator_new(0x208);
  std::ifstream::ifstream
            (pbVar3,(char *)fin._M_t.
                            super___uniq_ptr_impl<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::basic_ifstream<char,_std::char_traits<char>_>_*,_false>
                            ._M_head_impl,_S_in);
  std::unique_ptr<std::ifstream,std::default_delete<std::ifstream>>::
  unique_ptr<std::default_delete<std::ifstream>,void>
            ((unique_ptr<std::ifstream,std::default_delete<std::ifstream>> *)&local_20,pbVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
  if (bVar1) {
    pbVar4 = std::
             unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             ::operator*(&local_20);
    bVar2 = std::ios::operator!((ios *)(pbVar4 + *(long *)(*(long *)pbVar4 + -0x18)));
    if ((bVar2 & 1) == 0) {
      pbVar3 = std::
               unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
               ::operator->(&local_20);
      plVar5 = (long *)std::istream::read((char *)pbVar3,(long)&local_48);
      bVar2 = std::ios::operator!((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
      if ((bVar2 & 1) == 0) {
        pbVar3 = std::
                 unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                 ::operator->(&local_20);
        std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)auStack_58,0);
        plVar5 = (long *)std::istream::seekg(pbVar3,_auStack_58,local_50);
        bVar2 = std::ios::operator!((ios *)((long)plVar5 + *(long *)(*plVar5 + -0x18)));
        if ((bVar2 & 1) == 0) {
          if ((((local_48 == '\x7f') && (local_47 == 'E')) && (local_46 == 'L')) &&
             (local_45 == 'F')) {
            if (local_43 == '\x01') {
              local_5c = ByteOrderLSB;
            }
            else {
              if (local_43 != '\x02') {
                std::__cxx11::string::operator=
                          ((string *)&this->ErrorMessage,"ELF file is not LSB or MSB encoded.");
                goto LAB_0037c9cd;
              }
              local_5c = ByteOrderMSB;
            }
            if (local_44 == '\x01') {
              this_00 = (cmELFInternalImpl<cmELFTypes32> *)operator_new(0xc0);
              cmELFInternalImpl<cmELFTypes32>::cmELFInternalImpl(this_00,this,&local_20,local_5c);
              this->Internal = (cmELFInternal *)this_00;
            }
            else if (local_44 == '\x02') {
              this_01 = (cmELFInternalImpl<cmELFTypes64> *)operator_new(200);
              cmELFInternalImpl<cmELFTypes64>::cmELFInternalImpl(this_01,this,&local_20,local_5c);
              this->Internal = (cmELFInternal *)this_01;
            }
            else {
              std::__cxx11::string::operator=
                        ((string *)&this->ErrorMessage,"ELF file class is not 32-bit or 64-bit.");
            }
          }
          else {
            std::__cxx11::string::operator=
                      ((string *)&this->ErrorMessage,
                       "File does not have a valid ELF identification.");
          }
        }
        else {
          std::__cxx11::string::operator=
                    ((string *)&this->ErrorMessage,"Error seeking to beginning of file.");
        }
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)&this->ErrorMessage,"Error reading ELF identification.");
      }
      goto LAB_0037c9cd;
    }
  }
  std::__cxx11::string::operator=((string *)&this->ErrorMessage,"Error opening input file.");
LAB_0037c9cd:
  std::
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr(&local_20);
  return;
}

Assistant:

cmELF::cmELF(const char* fname)
  : Internal(nullptr)
{
  // Try to open the file.
  std::unique_ptr<cmsys::ifstream> fin(new cmsys::ifstream(fname));

  // Quit now if the file could not be opened.
  if (!fin || !*fin) {
    this->ErrorMessage = "Error opening input file.";
    return;
  }

  // Read the ELF identification block.
  char ident[EI_NIDENT];
  if (!fin->read(ident, EI_NIDENT)) {
    this->ErrorMessage = "Error reading ELF identification.";
    return;
  }
  if (!fin->seekg(0)) {
    this->ErrorMessage = "Error seeking to beginning of file.";
    return;
  }

  // Verify the ELF identification.
  if (!(ident[EI_MAG0] == ELFMAG0 && ident[EI_MAG1] == ELFMAG1 &&
        ident[EI_MAG2] == ELFMAG2 && ident[EI_MAG3] == ELFMAG3)) {
    this->ErrorMessage = "File does not have a valid ELF identification.";
    return;
  }

  // Check the byte order in which the rest of the file is encoded.
  cmELFInternal::ByteOrderType order;
  if (ident[EI_DATA] == ELFDATA2LSB) {
    // File is LSB.
    order = cmELFInternal::ByteOrderLSB;
  } else if (ident[EI_DATA] == ELFDATA2MSB) {
    // File is MSB.
    order = cmELFInternal::ByteOrderMSB;
  } else {
    this->ErrorMessage = "ELF file is not LSB or MSB encoded.";
    return;
  }

  // Check the class of the file and construct the corresponding
  // parser implementation.
  if (ident[EI_CLASS] == ELFCLASS32) {
    // 32-bit ELF
    this->Internal = new cmELFInternalImpl<cmELFTypes32>(this, fin, order);
  }
#ifndef _SCO_DS
  else if (ident[EI_CLASS] == ELFCLASS64) {
    // 64-bit ELF
    this->Internal = new cmELFInternalImpl<cmELFTypes64>(this, fin, order);
  }
#endif
  else {
    this->ErrorMessage = "ELF file class is not 32-bit or 64-bit.";
    return;
  }